

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagebox.cpp
# Opt level: O0

void __thiscall QtMWidgets::MsgBoxTitlePrivate::prepareTitle(MsgBoxTitlePrivate *this)

{
  int iVar1;
  int iVar2;
  QLatin1String local_a0;
  QString local_90;
  QWidget local_78 [8];
  int local_70;
  int averageCount;
  QWidget local_60 [8];
  QRect local_58;
  QRect *local_48;
  QRect *b;
  QRect local_30;
  undefined1 local_20 [8];
  QRect r;
  MsgBoxTitlePrivate *this_local;
  
  r._8_8_ = this;
  local_30 = QWidget::rect(&this->q->super_QWidget);
  QMargins::QMargins((QMargins *)&b,this->margin,0,this->margin,0);
  _local_20 = QRect::marginsRemoved(&local_30,(QMargins *)&b);
  QWidget::fontMetrics(local_60);
  local_58 = (QRect)QFontMetrics::boundingRect
                              ((QRect *)local_60,(int)local_20,(QString *)0x1,(int)this + 8,
                               (int *)0x0);
  QFontMetrics::~QFontMetrics((QFontMetrics *)local_60);
  local_48 = &local_58;
  QString::operator=(&this->preparedTitle,(QString *)&this->title);
  iVar1 = QRect::width(local_48);
  iVar2 = QRect::width((QRect *)local_20);
  if (iVar2 < iVar1) {
    iVar1 = QRect::width((QRect *)local_20);
    QWidget::fontMetrics(local_78);
    iVar2 = QFontMetrics::averageCharWidth();
    QFontMetrics::~QFontMetrics((QFontMetrics *)local_78);
    local_70 = iVar1 / iVar2;
    QString::left((longlong)&local_90);
    QString::operator=(&this->preparedTitle,&local_90);
    QString::~QString(&local_90);
    QLatin1String::QLatin1String(&local_a0,"...");
    QString::append((QLatin1String *)&this->preparedTitle);
  }
  return;
}

Assistant:

void
MsgBoxTitlePrivate::prepareTitle()
{
	const QRect r = q->rect().marginsRemoved( QMargins( margin, 0,
		margin, 0 ) );

	const QRect & b = q->fontMetrics().boundingRect( r,
		Qt::AlignLeft, title );

	preparedTitle = title;

	if( b.width() > r.width() )
	{
		const int averageCount = r.width() / q->fontMetrics().averageCharWidth();

		preparedTitle = title.left( averageCount - 3 );
		preparedTitle.append( QLatin1String( "..." ) );
	}
}